

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_energy.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Setprecision _Var1;
  istream *piVar2;
  ostream *poVar3;
  undefined8 *in_RSI;
  int in_EDI;
  fvar<double,_2UL> result;
  autodiff_fvar<double,_2UL> beta;
  real_t t;
  real_t t_step;
  real_t t_max;
  real_t t_min;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  double in_stack_00000240;
  double in_stack_00000248;
  double in_stack_00000250;
  array<double,_3UL> in_stack_00000260;
  char **in_stack_ffffffffffffff40;
  fvar<double,_2UL> *cr;
  ostream *in_stack_ffffffffffffff50;
  char **local_60;
  fvar<double,_2UL> *local_58;
  double local_50;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 7) {
    local_18 = boost::lexical_cast<double,char*>(in_stack_ffffffffffffff40);
    local_20 = boost::lexical_cast<double,char*>(in_stack_ffffffffffffff40);
    local_28 = boost::lexical_cast<double,char*>(in_stack_ffffffffffffff40);
    local_30 = boost::lexical_cast<double,char*>(in_stack_ffffffffffffff40);
    local_38 = boost::lexical_cast<double,char*>(in_stack_ffffffffffffff40);
    local_40 = boost::lexical_cast<double,char*>(in_stack_ffffffffffffff40);
  }
  else {
    if (in_EDI != 1) {
      local_10 = in_RSI;
      poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
      poVar3 = std::operator<<(poVar3,(char *)*local_10);
      std::operator<<(poVar3," [Ja Jb Jc t_min t_max t_step]\n");
      return 0x7f;
    }
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_18);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_20);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_28);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_30);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_38);
    std::istream::operator>>(piVar2,&local_40);
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var1 = std::setprecision(0xf);
  std::operator<<(poVar3,_Var1);
  std::operator<<((ostream *)&std::cout,"# triangular lattice Ising model\n");
  std::operator<<((ostream *)&std::cout,
                  "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n");
  for (local_50 = local_30; local_50 <= local_38; local_50 = local_40 + local_50) {
    boost::math::differentiation::autodiff_v1::make_fvar<double,_2UL>
              ((double *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff40 = local_60;
    cr = local_58;
    ising::free_energy::triangular::
    infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
              (in_stack_00000250,in_stack_00000248,in_stack_00000240,
               (fvar<double,_2UL>)in_stack_00000260._M_elems);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_18);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50);
    std::operator<<(poVar3,' ');
    poVar3 = boost::math::differentiation::autodiff_v1::detail::operator<<
                       (in_stack_ffffffffffffff50,cr);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  typedef double real_t;
  real_t Ja, Jb, Jc, t_min, t_max, t_step;
  if (argc == 7) {
    Ja = boost::lexical_cast<real_t>(argv[1]);
    Jb = boost::lexical_cast<real_t>(argv[2]);
    Jc = boost::lexical_cast<real_t>(argv[3]);
    t_min = boost::lexical_cast<real_t>(argv[4]);
    t_max = boost::lexical_cast<real_t>(argv[5]);
    t_step = boost::lexical_cast<real_t>(argv[6]);
  } else if (argc == 1) {
    std::cin >> Ja >> Jb >> Jc >> t_min >> t_max >> t_step;
  } else {
    std::cerr << "Usage: " << argv[0] << " [Ja Jb Jc t_min t_max t_step]\n";
    return 127;
  }
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10);
  std::cout << "# triangular lattice Ising model\n";
  std::cout << "# Ja, Jb, Jc, T, free energy density, energy density, specific heat\n";
  for (real_t t = t_min; t <= t_max; t += t_step) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto result = ising::free_energy::triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' ' << result << std::endl;
  }
}